

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_peobj.c
# Opt level: O3

void emit_peobj(BuildCtx *ctx)

{
  uint uVar1;
  char *__s;
  size_t sVar2;
  size_t sVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  int *piVar9;
  PEreloc reloc;
  PEreloc reloc_1;
  undefined8 local_118;
  ulong uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined4 local_f8;
  int local_f4;
  undefined2 local_f0;
  undefined8 local_ec;
  int local_e4;
  int local_e0;
  undefined4 local_dc;
  undefined1 local_d8 [44];
  undefined2 local_ac;
  undefined4 local_a0;
  int local_9c;
  int local_98;
  undefined2 local_90;
  undefined8 local_8c;
  undefined2 local_84;
  undefined4 local_78;
  int local_74;
  int local_70;
  undefined2 local_68;
  undefined4 local_64;
  undefined8 local_60;
  int local_50;
  int local_4c;
  undefined4 local_3c;
  
  memset(local_d8 + 5,0,0x97);
  local_d8[0] = '.';
  local_d8[1] = 't';
  local_d8[2] = 'e';
  local_d8[3] = 'x';
  local_d8[4] = 't';
  local_d8._20_4_ = 0xb4;
  local_d8._16_4_ = (undefined4)ctx->codesz;
  local_d8._24_4_ = local_d8._16_4_ + 0xb4;
  uVar4 = ctx->nreloc & 0xffff;
  local_d8._32_2_ = (undefined2)ctx->nreloc;
  iVar5 = local_d8._16_4_ + 0xb4 + uVar4 * 10;
  local_d8._36_8_ = 0x6164702e60500020;
  local_ac = 0x6174;
  local_a0 = 0x18;
  local_98 = local_d8._16_4_ + 0xcc + uVar4 * 10;
  local_90 = 6;
  local_74 = local_d8._16_4_ + 0x108 + uVar4 * 10;
  local_8c = 0x6164782e40300040;
  local_84 = 0x6174;
  local_78 = 0x20;
  local_70 = local_d8._16_4_ + 0x128 + uVar4 * 10;
  local_68 = 1;
  local_4c = local_d8._16_4_ + 0x132 + uVar4 * 10;
  local_64 = 0x40300040;
  local_60 = 0x5a2461746164722e;
  local_9c = iVar5;
  sVar3 = strlen(ctx->dasm_ident);
  local_50 = (int)sVar3 + 1;
  local_e4 = (int)sVar3 + iVar5 + 0x7f;
  local_3c = 0x40300040;
  local_ec = 0x48664;
  local_dc = 0;
  uVar4 = ctx->nrelocsym;
  local_e0 = uVar4 + 0xb + ctx->nsym;
  owrite(ctx,&local_ec,0x14);
  owrite(ctx,local_d8,0xa0);
  owrite(ctx,ctx->code,ctx->codesz);
  if (0 < ctx->nreloc) {
    piVar9 = &ctx->reloc[0].type;
    lVar6 = 0;
    do {
      local_118 = CONCAT44(piVar9[-1] + 3,((BuildReloc *)(piVar9 + -2))->ofs);
      uStack_110 = CONCAT62(uStack_110._2_6_,(*piVar9 != 0) + 2 + (ushort)(*piVar9 != 0));
      owrite(ctx,&local_118,10);
      lVar6 = lVar6 + 1;
      piVar9 = piVar9 + 3;
    } while (lVar6 < ctx->nreloc);
  }
  uVar1 = ctx->sym[(long)ctx->nsym + -1].ofs;
  local_118 = (ulong)uVar1 << 0x20;
  uStack_110 = uStack_110 & 0xffffffff00000000;
  owrite(ctx,&local_118,0xc);
  local_118 = CONCAT44((int)ctx->codesz,uVar1);
  uStack_110 = CONCAT44(uStack_110._4_4_,0x14);
  owrite(ctx,&local_118,0xc);
  local_f8 = 0;
  iVar5 = uVar4 + 8;
  local_f0 = 3;
  local_f4 = iVar5;
  owrite(ctx,&local_f8,10);
  local_f8 = 4;
  local_f0 = 3;
  local_f4 = iVar5;
  owrite(ctx,&local_f8,10);
  local_f8 = 8;
  local_f0 = 3;
  local_f4 = uVar4 + 5;
  owrite(ctx,&local_f8,10);
  local_f8 = 0xc;
  local_f0 = 3;
  local_f4 = iVar5;
  owrite(ctx,&local_f8,10);
  local_f8 = 0x10;
  local_f0 = 3;
  local_f4 = iVar5;
  owrite(ctx,&local_f8,10);
  local_f8 = 0x14;
  local_f0 = 3;
  local_f4 = uVar4 + 5;
  owrite(ctx,&local_f8,10);
  local_118 = 0x3000420000050019;
  uStack_110 = 0x500070006000;
  local_108 = 0x1504000100000000;
  uStack_100 = 0x5000300002000300;
  owrite(ctx,&local_118,0x20);
  local_f8 = 0x10;
  local_f0 = 3;
  local_f4 = uVar4 + 7;
  owrite(ctx,&local_f8,10);
  __s = ctx->dasm_ident;
  sVar3 = strlen(__s);
  owrite(ctx,__s,sVar3 + 1);
  strtab = (char *)0x0;
  while( true ) {
    strtabofs = 4;
    emit_peobj_sym(ctx,"@feat.00",1,-2,0,3);
    emit_peobj_sym_sect(ctx,(PEsection *)local_d8,0);
    if (0 < (int)uVar4) {
      uVar7 = 0;
      do {
        emit_peobj_sym(ctx,ctx->relocsym[uVar7],0,-1,0x20,2);
        uVar7 = uVar7 + 1;
      } while (uVar4 != uVar7);
    }
    emit_peobj_sym_sect(ctx,(PEsection *)local_d8,1);
    emit_peobj_sym_sect(ctx,(PEsection *)local_d8,2);
    emit_peobj_sym(ctx,"lj_err_unwind_win",0,-1,0x20,2);
    emit_peobj_sym(ctx,ctx->beginsym,0,0,0,2);
    if (0 < ctx->nsym) {
      lVar6 = 8;
      lVar8 = 0;
      do {
        emit_peobj_sym(ctx,*(char **)((long)ctx->sym + lVar6 + -8),
                       *(uint32_t *)((long)&ctx->sym->name + lVar6),0,0x20,2);
        lVar8 = lVar8 + 1;
        lVar6 = lVar6 + 0x10;
      } while (lVar8 < ctx->nsym);
    }
    emit_peobj_sym_sect(ctx,(PEsection *)local_d8,3);
    sVar2 = strtabofs;
    if (strtab != (char *)0x0) break;
    strtab = (char *)malloc(strtabofs);
    *(int *)strtab = (int)sVar2;
  }
  owrite(ctx,strtab,strtabofs);
  return;
}

Assistant:

void emit_peobj(BuildCtx *ctx)
{
  PEheader pehdr;
  PEsection pesect[PEOBJ_NSECTIONS];
  uint32_t sofs;
  int i, nrsym;
  union { uint8_t b; uint32_t u; } host_endian;

  sofs = sizeof(PEheader) + PEOBJ_NSECTIONS*sizeof(PEsection);

  /* Fill in PE sections. */
  memset(&pesect, 0, PEOBJ_NSECTIONS*sizeof(PEsection));
  memcpy(pesect[PEOBJ_SECT_TEXT].name, ".text", sizeof(".text")-1);
  pesect[PEOBJ_SECT_TEXT].ofs = sofs;
  sofs += (pesect[PEOBJ_SECT_TEXT].size = (uint32_t)ctx->codesz);
  pesect[PEOBJ_SECT_TEXT].relocofs = sofs;
  sofs += (pesect[PEOBJ_SECT_TEXT].nreloc = (uint16_t)ctx->nreloc) * PEOBJ_RELOC_SIZE;
  /* Flags: 60 = read+execute, 50 = align16, 20 = code. */
  pesect[PEOBJ_SECT_TEXT].flags = PEOBJ_TEXT_FLAGS;

#if LJ_TARGET_X64
  memcpy(pesect[PEOBJ_SECT_PDATA].name, ".pdata", sizeof(".pdata")-1);
  pesect[PEOBJ_SECT_PDATA].ofs = sofs;
  sofs += (pesect[PEOBJ_SECT_PDATA].size = 6*4);
  pesect[PEOBJ_SECT_PDATA].relocofs = sofs;
  sofs += (pesect[PEOBJ_SECT_PDATA].nreloc = 6) * PEOBJ_RELOC_SIZE;
  /* Flags: 40 = read, 30 = align4, 40 = initialized data. */
  pesect[PEOBJ_SECT_PDATA].flags = 0x40300040;

  memcpy(pesect[PEOBJ_SECT_XDATA].name, ".xdata", sizeof(".xdata")-1);
  pesect[PEOBJ_SECT_XDATA].ofs = sofs;
  sofs += (pesect[PEOBJ_SECT_XDATA].size = 8*2+4+6*2);  /* See below. */
  pesect[PEOBJ_SECT_XDATA].relocofs = sofs;
  sofs += (pesect[PEOBJ_SECT_XDATA].nreloc = 1) * PEOBJ_RELOC_SIZE;
  /* Flags: 40 = read, 30 = align4, 40 = initialized data. */
  pesect[PEOBJ_SECT_XDATA].flags = 0x40300040;
#elif LJ_TARGET_X86
  memcpy(pesect[PEOBJ_SECT_SXDATA].name, ".sxdata", sizeof(".sxdata")-1);
  pesect[PEOBJ_SECT_SXDATA].ofs = sofs;
  sofs += (pesect[PEOBJ_SECT_SXDATA].size = 4);
  pesect[PEOBJ_SECT_SXDATA].relocofs = sofs;
  /* Flags: 40 = read, 30 = align4, 02 = lnk_info, 40 = initialized data. */
  pesect[PEOBJ_SECT_SXDATA].flags = 0x40300240;
#endif

  memcpy(pesect[PEOBJ_SECT_RDATA_Z].name, ".rdata$Z", sizeof(".rdata$Z")-1);
  pesect[PEOBJ_SECT_RDATA_Z].ofs = sofs;
  sofs += (pesect[PEOBJ_SECT_RDATA_Z].size = (uint32_t)strlen(ctx->dasm_ident)+1);
  /* Flags: 40 = read, 30 = align4, 40 = initialized data. */
  pesect[PEOBJ_SECT_RDATA_Z].flags = 0x40300040;

  /* Fill in PE header. */
  pehdr.arch = PEOBJ_ARCH_TARGET;
  pehdr.nsects = PEOBJ_NSECTIONS;
  pehdr.time = 0;  /* Timestamp is optional. */
  pehdr.symtabofs = sofs;
  pehdr.opthdrsz = 0;
  pehdr.flags = 0;

  /* Compute the size of the symbol table:
  ** @feat.00 + nsections*2
  ** + asm_start + nsym
  ** + nrsym
  */
  nrsym = ctx->nrelocsym;
  pehdr.nsyms = 1+PEOBJ_NSECTIONS*2 + 1+ctx->nsym + nrsym;
#if LJ_TARGET_X64
  pehdr.nsyms += 1;  /* Symbol for lj_err_unwind_win. */
#endif

  /* Write PE object header and all sections. */
  owrite(ctx, &pehdr, sizeof(PEheader));
  owrite(ctx, &pesect, sizeof(PEsection)*PEOBJ_NSECTIONS);

  /* Write .text section. */
  host_endian.u = 1;
  if (host_endian.b != LJ_ENDIAN_SELECT(1, 0)) {
#if LJ_TARGET_PPC
    uint32_t *p = (uint32_t *)ctx->code;
    int n = (int)(ctx->codesz >> 2);
    for (i = 0; i < n; i++, p++)
      *p = lj_bswap(*p);  /* Byteswap .text section. */
#else
    fprintf(stderr, "Error: different byte order for host and target\n");
    exit(1);
#endif
  }
  owrite(ctx, ctx->code, ctx->codesz);
  for (i = 0; i < ctx->nreloc; i++) {
    PEreloc reloc;
    reloc.vaddr = (uint32_t)ctx->reloc[i].ofs + PEOBJ_RELOC_OFS;
    reloc.symidx = 1+2+ctx->reloc[i].sym;  /* Reloc syms are after .text sym. */
    reloc.type = ctx->reloc[i].type ? PEOBJ_RELOC_REL32 : PEOBJ_RELOC_DIR32;
    owrite(ctx, &reloc, PEOBJ_RELOC_SIZE);
  }

#if LJ_TARGET_X64
  { /* Write .pdata section. */
    uint32_t fcofs = (uint32_t)ctx->sym[ctx->nsym-1].ofs;
    uint32_t pdata[3];  /* Start of .text, end of .text and .xdata. */
    PEreloc reloc;
    pdata[0] = 0; pdata[1] = fcofs; pdata[2] = 0;
    owrite(ctx, &pdata, sizeof(pdata));
    pdata[0] = fcofs; pdata[1] = (uint32_t)ctx->codesz; pdata[2] = 20;
    owrite(ctx, &pdata, sizeof(pdata));
    reloc.vaddr = 0; reloc.symidx = 1+2+nrsym+2+2+1;
    reloc.type = PEOBJ_RELOC_ADDR32NB;
    owrite(ctx, &reloc, PEOBJ_RELOC_SIZE);
    reloc.vaddr = 4; reloc.symidx = 1+2+nrsym+2+2+1;
    reloc.type = PEOBJ_RELOC_ADDR32NB;
    owrite(ctx, &reloc, PEOBJ_RELOC_SIZE);
    reloc.vaddr = 8; reloc.symidx = 1+2+nrsym+2;
    reloc.type = PEOBJ_RELOC_ADDR32NB;
    owrite(ctx, &reloc, PEOBJ_RELOC_SIZE);
    reloc.vaddr = 12; reloc.symidx = 1+2+nrsym+2+2+1;
    reloc.type = PEOBJ_RELOC_ADDR32NB;
    owrite(ctx, &reloc, PEOBJ_RELOC_SIZE);
    reloc.vaddr = 16; reloc.symidx = 1+2+nrsym+2+2+1;
    reloc.type = PEOBJ_RELOC_ADDR32NB;
    owrite(ctx, &reloc, PEOBJ_RELOC_SIZE);
    reloc.vaddr = 20; reloc.symidx = 1+2+nrsym+2;
    reloc.type = PEOBJ_RELOC_ADDR32NB;
    owrite(ctx, &reloc, PEOBJ_RELOC_SIZE);
  }
  { /* Write .xdata section. */
    uint16_t xdata[8+2+6];
    PEreloc reloc;
    xdata[0] = 0x01|0x08|0x10;  /* Ver. 1, uhandler/ehandler, prolog size 0. */
    xdata[1] = 0x0005;  /* Number of unwind codes, no frame pointer. */
    xdata[2] = 0x4200;  /* Stack offset 4*8+8 = aword*5. */
    xdata[3] = 0x3000;  /* Push rbx. */
    xdata[4] = 0x6000;  /* Push rsi. */
    xdata[5] = 0x7000;  /* Push rdi. */
    xdata[6] = 0x5000;  /* Push rbp. */
    xdata[7] = 0;  /* Alignment. */
    xdata[8] = xdata[9] = 0;  /* Relocated address of exception handler. */
    xdata[10] = 0x01;  /* Ver. 1, no handler, prolog size 0. */
    xdata[11] = 0x1504;  /* Number of unwind codes, fp = rbp, fpofs = 16. */
    xdata[12] = 0x0300;  /* set_fpreg. */
    xdata[13] = 0x0200;  /* stack offset 0*8+8 = aword*1. */
    xdata[14] = 0x3000;  /* Push rbx. */
    xdata[15] = 0x5000;  /* Push rbp. */
    owrite(ctx, &xdata, sizeof(xdata));
    reloc.vaddr = 2*8; reloc.symidx = 1+2+nrsym+2+2;
    reloc.type = PEOBJ_RELOC_ADDR32NB;
    owrite(ctx, &reloc, PEOBJ_RELOC_SIZE);
  }
#elif LJ_TARGET_X86
  /* Write .sxdata section. */
  for (i = 0; i < nrsym; i++) {
    if (!strcmp(ctx->relocsym[i], "_lj_err_unwind_win")) {
      uint32_t symidx = 1+2+i;
      owrite(ctx, &symidx, 4);
      break;
    }
  }
  if (i == nrsym) {
    fprintf(stderr, "Error: extern lj_err_unwind_win not used\n");
    exit(1);
  }
#endif

  /* Write .rdata$Z section. */
  owrite(ctx, ctx->dasm_ident, strlen(ctx->dasm_ident)+1);

  /* Write symbol table. */
  strtab = NULL;  /* 1st pass: collect string sizes. */
  for (;;) {
    strtabofs = 4;
    /* Mark as SafeSEH compliant. */
    emit_peobj_sym(ctx, "@feat.00", 1,
		   PEOBJ_SECT_ABS, PEOBJ_TYPE_NULL, PEOBJ_SCL_STATIC);

    emit_peobj_sym_sect(ctx, pesect, PEOBJ_SECT_TEXT);
    for (i = 0; i < nrsym; i++)
      emit_peobj_sym(ctx, ctx->relocsym[i], 0,
		     PEOBJ_SECT_UNDEF, PEOBJ_TYPE_FUNC, PEOBJ_SCL_EXTERN);

#if LJ_TARGET_X64
    emit_peobj_sym_sect(ctx, pesect, PEOBJ_SECT_PDATA);
    emit_peobj_sym_sect(ctx, pesect, PEOBJ_SECT_XDATA);
    emit_peobj_sym(ctx, "lj_err_unwind_win", 0,
		   PEOBJ_SECT_UNDEF, PEOBJ_TYPE_FUNC, PEOBJ_SCL_EXTERN);
#elif LJ_TARGET_X86
    emit_peobj_sym_sect(ctx, pesect, PEOBJ_SECT_SXDATA);
#endif

    emit_peobj_sym(ctx, ctx->beginsym, 0,
		   PEOBJ_SECT_TEXT, PEOBJ_TYPE_NULL, PEOBJ_SCL_EXTERN);
    for (i = 0; i < ctx->nsym; i++)
      emit_peobj_sym(ctx, ctx->sym[i].name, (uint32_t)ctx->sym[i].ofs,
		     PEOBJ_SECT_TEXT, PEOBJ_TYPE_FUNC, PEOBJ_SCL_EXTERN);

    emit_peobj_sym_sect(ctx, pesect, PEOBJ_SECT_RDATA_Z);

    if (strtab)
      break;
    /* 2nd pass: alloc strtab, write syms and copy strings. */
    strtab = (char *)malloc(strtabofs);
    *(uint32_t *)strtab = (uint32_t)strtabofs;
  }

  /* Write string table. */
  owrite(ctx, strtab, strtabofs);
}